

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.h
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::DataChunk::DataChunk(DataChunk *this,ArenaAllocator *allocator,uint initSize)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  uchar *puVar1;
  TrackAllocData local_48;
  uint local_1c;
  ArenaAllocator *pAStack_18;
  uint initSize_local;
  ArenaAllocator *allocator_local;
  DataChunk *this_local;
  
  this->byteSize = initSize;
  this->nextChunk = (DataChunk *)0x0;
  local_1c = initSize;
  pAStack_18 = allocator;
  allocator_local = (ArenaAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&unsigned_char::typeinfo,0,(ulong)initSize,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeWriter.h"
             ,0x19);
  this_00 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo(&allocator->
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                           ,&local_48);
  puVar1 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_char,false>
                     ((Memory *)this_00,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                      (ulong)local_1c);
  this->buffer = puVar1;
  this->currentByte = this->buffer;
  return;
}

Assistant:

DataChunk(ArenaAllocator* allocator, uint initSize) :
                nextChunk(nullptr),
                byteSize(initSize)
            {
                buffer = AnewArray(allocator, byte, initSize);
                currentByte = buffer;
            }